

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall anon_unknown.dwarf_515ef::ChoiceExpr::parse_term(ChoiceExpr *this,Context *con)

{
  element_type *peVar1;
  int iVar2;
  ParsingState st;
  ParsingState local_38;
  
  local_38.position.line = (con->position).line;
  local_38.position.col = (con->position).col;
  local_38.position.it.buffer._0_4_ = *(undefined4 *)&(con->position).it.buffer;
  local_38.position.it.buffer._4_4_ = *(undefined4 *)((long)&(con->position).it.buffer + 4);
  local_38.position.it.idx._0_4_ = (undefined4)(con->position).it.idx;
  local_38.position.it.idx._4_4_ = *(undefined4 *)((long)&(con->position).it.idx + 4);
  local_38.matches =
       ((long)(con->matches).
              super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(con->matches).
              super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  iVar2 = (*((this->super_BinaryExpr).left.super_shared_ptr<pegmatite::Expr>.
             super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Expr[3])
                    ();
  if ((char)iVar2 != '\0') {
    return true;
  }
  pegmatite::Context::restore(con,&local_38);
  peVar1 = (this->super_BinaryExpr).right.super_shared_ptr<pegmatite::Expr>.
           super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_Expr[3])(peVar1,con);
  return SUB41(iVar2,0);
}

Assistant:

virtual bool parse_term(Context &con) const
	{
		ParsingState st(con);
		if (left->parse_term(con)) return true;
		con.restore(st);
		return right->parse_term(con);
	}